

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_7c221d::CodemodelConfig::DumpDirectory
          (Value *__return_storage_ptr__,CodemodelConfig *this,Directory *d)

{
  cmStateSnapshot s;
  cmStateSnapshot s_00;
  bool bVar1;
  ArrayIndex AVar2;
  string *psVar3;
  Value *pVVar4;
  Value local_368;
  Value local_340;
  cmState *local_318;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcStack_310;
  PositionType local_308;
  undefined1 local_2f8 [8];
  Value minimumCMakeVersion;
  Value local_2a8;
  Value local_280;
  cmStateSnapshot local_258;
  Value local_240;
  reference local_218;
  cmStateSnapshot *child;
  iterator __end1;
  iterator __begin1;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *__range1;
  Value childIndexes;
  Value local_198;
  undefined1 auStack_170 [8];
  cmStateSnapshot parentDir;
  Value local_138;
  cmStateDirectory local_110;
  undefined1 local_e8 [8];
  string buildDir;
  Value local_a8;
  cmStateDirectory local_70;
  undefined1 local_48 [8];
  string sourceDir;
  Directory *d_local;
  CodemodelConfig *this_local;
  Value *directory;
  
  sourceDir.field_2._M_local_buf[0xf] = '\0';
  Json::Value::Value(__return_storage_ptr__,objectValue);
  cmStateSnapshot::GetDirectory(&local_70,&d->Snapshot);
  psVar3 = cmStateDirectory::GetCurrentSource_abi_cxx11_(&local_70);
  std::__cxx11::string::string((string *)local_48,(string *)psVar3);
  RelativeIfUnder((string *)((long)&buildDir.field_2 + 8),&this->TopSource,(string *)local_48);
  Json::Value::Value(&local_a8,(string *)((long)&buildDir.field_2 + 8));
  pVVar4 = Json::Value::operator[](__return_storage_ptr__,"source");
  Json::Value::operator=(pVVar4,&local_a8);
  Json::Value::~Value(&local_a8);
  std::__cxx11::string::~string((string *)(buildDir.field_2._M_local_buf + 8));
  cmStateSnapshot::GetDirectory(&local_110,&d->Snapshot);
  psVar3 = cmStateDirectory::GetCurrentBinary_abi_cxx11_(&local_110);
  std::__cxx11::string::string((string *)local_e8,(string *)psVar3);
  RelativeIfUnder((string *)&parentDir.Position.Position,&this->TopBuild,(string *)local_e8);
  Json::Value::Value(&local_138,(string *)&parentDir.Position.Position);
  pVVar4 = Json::Value::operator[](__return_storage_ptr__,"build");
  Json::Value::operator=(pVVar4,&local_138);
  Json::Value::~Value(&local_138);
  std::__cxx11::string::~string((string *)&parentDir.Position.Position);
  cmStateSnapshot::GetBuildsystemDirectoryParent((cmStateSnapshot *)auStack_170,&d->Snapshot);
  bVar1 = cmStateSnapshot::IsValid((cmStateSnapshot *)auStack_170);
  if (bVar1) {
    childIndexes.limit_ = (ptrdiff_t)auStack_170;
    s.Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)parentDir.State;
    s.State = (cmState *)auStack_170;
    s.Position.Position = (PositionType)parentDir.Position.Tree;
    AVar2 = GetDirectoryIndex(this,s);
    Json::Value::Value(&local_198,AVar2);
    pVVar4 = Json::Value::operator[](__return_storage_ptr__,"parentIndex");
    Json::Value::operator=(pVVar4,&local_198);
    Json::Value::~Value(&local_198);
  }
  Json::Value::Value((Value *)&__range1,arrayValue);
  cmStateSnapshot::GetChildren
            ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&__begin1,&d->Snapshot);
  __end1 = std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::begin
                     ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&__begin1);
  child = (cmStateSnapshot *)
          std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::end
                    ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&__begin1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
                                     *)&child), bVar1) {
    local_218 = __gnu_cxx::
                __normal_iterator<cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
                ::operator*(&__end1);
    cmStateSnapshot::GetBuildsystemDirectory(&local_258,local_218);
    s_00.Position.Tree = local_258.Position.Tree;
    s_00.State = local_258.State;
    s_00.Position.Position = local_258.Position.Position;
    AVar2 = GetDirectoryIndex(this,s_00);
    Json::Value::Value(&local_240,AVar2);
    Json::Value::append((Value *)&__range1,&local_240);
    Json::Value::~Value(&local_240);
    __gnu_cxx::
    __normal_iterator<cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
    ::operator++(&__end1);
  }
  std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::~vector
            ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&__begin1);
  bVar1 = Json::Value::empty((Value *)&__range1);
  if (!bVar1) {
    Json::Value::Value(&local_280,(Value *)&__range1);
    pVVar4 = Json::Value::operator[](__return_storage_ptr__,"childIndexes");
    Json::Value::operator=(pVVar4,&local_280);
    Json::Value::~Value(&local_280);
  }
  Json::Value::Value(&local_2a8,d->ProjectIndex);
  pVVar4 = Json::Value::operator[](__return_storage_ptr__,"projectIndex");
  Json::Value::operator=(pVVar4,&local_2a8);
  Json::Value::~Value(&local_2a8);
  bVar1 = Json::Value::empty(&d->TargetIndexes);
  if (!bVar1) {
    Json::Value::Value((Value *)&minimumCMakeVersion.limit_,&d->TargetIndexes);
    pVVar4 = Json::Value::operator[](__return_storage_ptr__,"targetIndexes");
    Json::Value::operator=(pVVar4,(Value *)&minimumCMakeVersion.limit_);
    Json::Value::~Value((Value *)&minimumCMakeVersion.limit_);
  }
  local_308 = (d->Snapshot).Position.Position;
  local_318 = (d->Snapshot).State;
  pcStack_310 = (d->Snapshot).Position.Tree;
  DumpMinimumCMakeVersion((Value *)local_2f8,this,d->Snapshot);
  bVar1 = Json::Value::isNull((Value *)local_2f8);
  if (!bVar1) {
    Json::Value::Value(&local_340,(Value *)local_2f8);
    pVVar4 = Json::Value::operator[](__return_storage_ptr__,"minimumCMakeVersion");
    Json::Value::operator=(pVVar4,&local_340);
    Json::Value::~Value(&local_340);
  }
  if ((d->HasInstallRule & 1U) != 0) {
    Json::Value::Value(&local_368,true);
    pVVar4 = Json::Value::operator[](__return_storage_ptr__,"hasInstallRule");
    Json::Value::operator=(pVVar4,&local_368);
    Json::Value::~Value(&local_368);
  }
  sourceDir.field_2._M_local_buf[0xf] = '\x01';
  Json::Value::~Value((Value *)local_2f8);
  Json::Value::~Value((Value *)&__range1);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string((string *)local_48);
  if ((sourceDir.field_2._M_local_buf[0xf] & 1U) == 0) {
    Json::Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value CodemodelConfig::DumpDirectory(Directory& d)
{
  Json::Value directory = Json::objectValue;

  std::string sourceDir = d.Snapshot.GetDirectory().GetCurrentSource();
  directory["source"] = RelativeIfUnder(this->TopSource, sourceDir);

  std::string buildDir = d.Snapshot.GetDirectory().GetCurrentBinary();
  directory["build"] = RelativeIfUnder(this->TopBuild, buildDir);

  cmStateSnapshot parentDir = d.Snapshot.GetBuildsystemDirectoryParent();
  if (parentDir.IsValid()) {
    directory["parentIndex"] = this->GetDirectoryIndex(parentDir);
  }

  Json::Value childIndexes = Json::arrayValue;
  for (cmStateSnapshot const& child : d.Snapshot.GetChildren()) {
    childIndexes.append(
      this->GetDirectoryIndex(child.GetBuildsystemDirectory()));
  }
  if (!childIndexes.empty()) {
    directory["childIndexes"] = std::move(childIndexes);
  }

  directory["projectIndex"] = d.ProjectIndex;

  if (!d.TargetIndexes.empty()) {
    directory["targetIndexes"] = std::move(d.TargetIndexes);
  }

  Json::Value minimumCMakeVersion = this->DumpMinimumCMakeVersion(d.Snapshot);
  if (!minimumCMakeVersion.isNull()) {
    directory["minimumCMakeVersion"] = std::move(minimumCMakeVersion);
  }

  if (d.HasInstallRule) {
    directory["hasInstallRule"] = true;
  }

  return directory;
}